

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O3

int replaceTxa(istream *in,ostream *output,path *replacement)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  pointer pcVar9;
  ulong uVar10;
  thread *ptVar11;
  _Alloc_hider _Var12;
  size_t sVar13;
  TxaChunk *chunk;
  size_type *psVar14;
  pointer __n;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX_00;
  anon_class_32_4_76e35334_for__M_head_impl *__args;
  anon_class_32_4_76e35334_for__M_head_impl *extraout_RDX_01;
  uint uVar15;
  thread *thread;
  _Alloc_hider _Var16;
  long lVar17;
  pointer pcVar18;
  long lVar19;
  ulong uVar20;
  thread *ptVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  bool indexed;
  char local_189;
  string replacementName;
  path rfilename;
  TxaHeader header;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  chunks;
  Compressor compressor;
  path local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string replacementTemplate;
  vector<Image,_std::allocator<Image>_> images;
  atomic<unsigned_long> i;
  path replacementDir;
  
  std::filesystem::__cxx11::path::parent_path();
  auVar23 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar23._8_8_ == 0 || auVar23._0_8_ == 0) {
    std::filesystem::__cxx11::path::path((path *)&header);
  }
  else {
    std::__cxx11::string::substr((ulong)&rfilename,auVar23._0_8_);
    std::filesystem::__cxx11::path::path((path *)&header,&rfilename._M_pathname,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rfilename._M_pathname._M_dataplus._M_p != &rfilename._M_pathname.field_2) {
      operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                      rfilename._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  replacementTemplate._M_dataplus._M_p = (pointer)&replacementTemplate.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&replacementTemplate,CONCAT44(header.filesize,header._0_4_),
             CONCAT44(header.largestDecodedChunk,header.indexed) +
             CONCAT44(header.filesize,header._0_4_));
  std::filesystem::__cxx11::path::~path((path *)&header);
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  rfilename._M_pathname.field_2._M_allocated_capacity = 0;
  rfilename._M_pathname.field_2._8_8_ = 0;
  rfilename._M_pathname._M_dataplus._M_p = (pointer)0x0;
  rfilename._M_pathname._M_string_length = 0;
  std::vector<Image,_std::allocator<Image>_>::vector
            (&images,((long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (value_type *)&rfilename,(allocator_type *)&local_e0);
  if (rfilename._M_pathname._M_string_length != 0) {
    operator_delete((void *)rfilename._M_pathname._M_string_length,
                    rfilename._M_pathname.field_2._8_8_ - rfilename._M_pathname._M_string_length);
  }
  rfilename._M_pathname._M_dataplus._M_p = (pointer)0x0;
  rfilename._M_pathname._M_string_length = 0;
  rfilename._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&chunks,((long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
           (value_type *)&rfilename,(allocator_type *)&local_e0);
  if (rfilename._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                    rfilename._M_pathname.field_2._M_allocated_capacity -
                    (long)rfilename._M_pathname._M_dataplus._M_p);
  }
  Compressor::Compressor(&compressor);
  indexed = true;
  if (chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar9 = (pointer)0x0;
    header.indexed = 1;
  }
  else {
    lVar17 = 0;
    lVar19 = 0;
    pcVar18 = (pointer)0x0;
    do {
      rfilename._M_pathname._M_dataplus._M_p = (pointer)&rfilename._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rfilename,replacementTemplate._M_dataplus._M_p,
                 replacementTemplate._M_dataplus._M_p + replacementTemplate._M_string_length);
      std::__cxx11::string::append((char *)&rfilename);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&rfilename,
                                  *(ulong *)((long)&((header.chunks.
                                                                                                            
                                                  super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->name).
                                                  _M_dataplus._M_p + lVar17));
      replacementName._M_dataplus._M_p = (pointer)&replacementName.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar14) {
        replacementName.field_2._M_allocated_capacity = *psVar14;
        replacementName.field_2._8_8_ = plVar8[3];
      }
      else {
        replacementName.field_2._M_allocated_capacity = *psVar14;
        replacementName._M_dataplus._M_p = (pointer)*plVar8;
      }
      replacementName._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rfilename._M_pathname._M_dataplus._M_p != &rfilename._M_pathname.field_2) {
        operator_delete(rfilename._M_pathname._M_dataplus._M_p,
                        rfilename._M_pathname.field_2._M_allocated_capacity + 1);
      }
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,replacementName._M_dataplus._M_p,
                 replacementName._M_dataplus._M_p + replacementName._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_e0,&__str_1,auto_format);
      std::filesystem::__cxx11::operator/(&rfilename,&replacementDir,&local_e0);
      std::filesystem::__cxx11::path::~path(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      Image::readPNG((Image *)&local_e0,&rfilename);
      *(pointer *)
       ((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                 super__Vector_impl_data._M_start)->size).width + lVar19) =
           local_e0._M_pathname._M_dataplus._M_p;
      pvVar2 = *(void **)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                   super__Vector_impl_data._M_start)->colorData).
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar19);
      lVar3 = *(long *)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                 super__Vector_impl_data._M_start)->colorData).
                               super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + lVar19);
      puVar1 = (undefined8 *)
               ((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                         super__Vector_impl_data._M_start)->colorData).
                       super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar19);
      *puVar1 = local_e0._M_pathname._M_string_length;
      puVar1[1] = local_e0._M_pathname.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                 super__Vector_impl_data._M_start)->colorData).
               super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + lVar19) = local_e0._M_pathname.field_2._8_8_;
      local_e0._M_pathname._M_string_length = 0;
      local_e0._M_pathname.field_2._M_allocated_capacity = 0;
      local_e0._M_pathname.field_2._8_8_ = 0;
      if ((pvVar2 != (void *)0x0) &&
         (operator_delete(pvVar2,lVar3 - (long)pvVar2),
         (void *)local_e0._M_pathname._M_string_length != (void *)0x0)) {
        operator_delete((void *)local_e0._M_pathname._M_string_length,
                        local_e0._M_pathname.field_2._8_8_ - local_e0._M_pathname._M_string_length);
      }
      bVar5 = Compressor::canPalette
                        (&compressor,
                         (Image *)((long)&((images.super__Vector_base<Image,_std::allocator<Image>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->size).width
                                  + lVar19),false);
      if (!bVar5) {
        fprintf(_stderr,
                "%s has too many colors to palette, disabling indexed color for all images\n",
                replacementName._M_dataplus._M_p);
        indexed = false;
      }
      std::filesystem::__cxx11::path::~path(&rfilename);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)replacementName._M_dataplus._M_p != &replacementName.field_2) {
        operator_delete(replacementName._M_dataplus._M_p,
                        replacementName.field_2._M_allocated_capacity + 1);
      }
      pcVar18 = pcVar18 + 1;
      pcVar9 = (pointer)(((long)chunks.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)chunks.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555);
      lVar19 = lVar19 + 0x20;
      lVar17 = lVar17 + 0x38;
    } while (pcVar18 < pcVar9);
    header.indexed = (uint32_t)indexed;
  }
  local_e0._M_pathname.field_2._M_allocated_capacity = (size_type)&images;
  local_e0._M_pathname.field_2._8_8_ = &header;
  local_e0._M_pathname._M_string_length = (size_type)&chunks;
  local_e0._M_pathname._M_dataplus._M_p = &indexed;
  uVar15 = 0;
  i.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  replacementName.field_2._M_allocated_capacity = 0;
  replacementName._M_dataplus._M_p = (pointer)0x0;
  replacementName._M_string_length = 0;
  __str_1._M_dataplus._M_p = pcVar9;
  iVar6 = std::thread::hardware_concurrency();
  __args = extraout_RDX;
  if (iVar6 != 0) {
    do {
      sVar4 = replacementName._M_string_length;
      _Var16._M_p = replacementName._M_dataplus._M_p;
      rfilename._M_pathname._M_dataplus._M_p = &local_189;
      rfilename._M_pathname._M_string_length = (size_type)&i;
      rfilename._M_pathname.field_2._M_allocated_capacity = (size_type)&__str_1;
      rfilename._M_pathname.field_2._8_8_ = &local_e0;
      if (replacementName._M_string_length == replacementName.field_2._M_allocated_capacity) {
        if (replacementName._M_string_length - (long)replacementName._M_dataplus._M_p ==
            0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar20 = (long)(replacementName._M_string_length - (long)replacementName._M_dataplus._M_p)
                 >> 3;
        uVar10 = uVar20 + (uVar20 == 0);
        uVar22 = uVar10 + uVar20;
        if (0xffffffffffffffe < uVar22) {
          uVar22 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar10,uVar20)) {
          uVar22 = 0xfffffffffffffff;
        }
        if (uVar22 == 0) {
          ptVar11 = (thread *)0x0;
        }
        else {
          ptVar11 = __gnu_cxx::new_allocator<std::thread>::allocate
                              ((new_allocator<std::thread> *)&replacementName,uVar22,(void *)0x0);
          __args = extraout_RDX_00;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                  ((allocator_type *)(ptVar11 + uVar20),(thread *)&rfilename,__args);
        ptVar21 = ptVar11;
        for (_Var12._M_p = _Var16._M_p; _Var12._M_p != (pointer)sVar4; _Var12._M_p = _Var12._M_p + 8
            ) {
          (ptVar21->_M_id)._M_thread = *(native_handle_type *)_Var12._M_p;
          *(native_handle_type *)_Var12._M_p = 0;
          ptVar21 = ptVar21 + 1;
        }
        if (_Var16._M_p != (pointer)0x0) {
          operator_delete(_Var16._M_p,
                          replacementName.field_2._M_allocated_capacity - (long)_Var16._M_p);
        }
        replacementName.field_2._M_allocated_capacity = (size_type)(ptVar11 + uVar22);
        replacementName._M_dataplus._M_p = (pointer)ptVar11;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_for<replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1>(unsigned_long,unsigned_long,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__0,replaceTxa(std::istream&,std::ostream&,std::filesystem::__cxx11::path_const&)::__1&&)::_lambda()_1_>
                  ((allocator_type *)replacementName._M_string_length,(thread *)&rfilename,__args);
        ptVar21 = (thread *)replacementName._M_string_length;
      }
      replacementName._M_string_length = (size_type)(ptVar21 + 1);
      uVar15 = uVar15 + 1;
      uVar7 = std::thread::hardware_concurrency();
      sVar4 = replacementName._M_string_length;
      __args = extraout_RDX_01;
      _Var16 = replacementName._M_dataplus;
    } while (uVar15 < uVar7);
    for (; _Var16._M_p != (pointer)sVar4; _Var16._M_p = _Var16._M_p + 8) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&replacementName);
  sVar13 = TxaHeader::updateAndCalcBinSize(&header);
  header.filesize = (uint32_t)sVar13;
  for (__n = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
      __n != header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
             super__Vector_impl_data._M_finish; __n = __n + 1) {
    uVar15 = (int)sVar13 + 0xfU & 0xfffffff0;
    __n->offset = uVar15;
    header.filesize = uVar15 + __n->length;
    sVar13 = (size_t)header.filesize;
  }
  TxaHeader::write(&header,(int)output,in,(size_t)__n);
  if (chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      chunks.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar17 = 8;
    uVar22 = 0;
    lVar19 = 8;
    do {
      std::ostream::seekp((long)output,
                          *(_Ios_Seekdir *)
                           ((long)&(header.chunks.
                                    super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                                    super__Vector_impl_data._M_start)->index + lVar17));
      std::ostream::write((char *)output,
                          *(long *)((long)chunks.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8));
      uVar22 = uVar22 + 1;
      lVar19 = lVar19 + 0x18;
      lVar17 = lVar17 + 0x38;
    } while (uVar22 < (ulong)(((long)chunks.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)chunks.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  Compressor::~Compressor(&compressor);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&chunks);
  std::vector<Image,_std::allocator<Image>_>::~vector(&images);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::~vector(&header.chunks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)replacementTemplate._M_dataplus._M_p != &replacementTemplate.field_2) {
    operator_delete(replacementTemplate._M_dataplus._M_p,
                    replacementTemplate.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&replacementDir);
  return 0;
}

Assistant:

int replaceTxa(std::istream &in, std::ostream &output, const fs::path &replacement) {
	fs::path replacementDir = replacement.parent_path();
	std::string replacementTemplate = replacement.stem().string();

	TxaHeader header;
	in >> header;

	std::vector<Image> images(header.chunks.size(), Image());
	std::vector<std::vector<uint8_t>> chunks(header.chunks.size(), std::vector<uint8_t>());
	Compressor compressor;

	bool indexed = true;

	for (size_t i = 0; i < chunks.size(); i++) {
		std::string replacementName = replacementTemplate + "_" + header.chunks[i].name;
		auto rfilename = replacementDir/fs::u8path(replacementName + ".png");

		try {
			images[i] = Image::readPNG(rfilename);
		} catch (std::runtime_error&) {
			fprintf(stderr, "Failed to load replacement %s, not replacing\n", rfilename.string().c_str());
			const auto& chunk = header.chunks[i];
			processChunkNoHeader(images[i], chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, replacementName, header.isSwitch);
		}

		if (!compressor.canPalette(images[i], false)) {
			fprintf(stderr, "%s has too many colors to palette, disabling indexed color for all images\n", replacementName.c_str());
			indexed = false;
		}
	}

	header.indexed = indexed;

	parallel_for(0, chunks.size(), []{ return Compressor(); }, [&](Compressor& c, size_t i) {
		ChunkHeader::Type type = indexed ? ChunkHeader::TYPE_INDEXED : ChunkHeader::TYPE_COLOR;
		if (!c.encodeHeaderlessChunk(chunks[i], images[i], type, header.isSwitch)) {
			throw std::runtime_error("Failed to encode chunk " + std::to_string(i));
		}
		auto& h = header.chunks[i];
		h.decodedLength = indexed ? (1024 + images[i].size.area()) : (4 * images[i].size.area());
		h.width = images[i].size.width;
		h.height = images[i].size.height;
		h.length = chunks[i].size();
	});

	int pos = header.updateAndCalcBinSize();
	for (auto& chunk : header.chunks) {
		pos = align(pos, 16);
		chunk.offset = pos;
		pos += chunk.length;
	}

	header.filesize = pos;
	header.write(output, in);
	for (size_t i = 0; i < chunks.size(); i++) {
		output.seekp(header.chunks[i].offset, output.beg);
		output.write(reinterpret_cast<const char*>(chunks[i].data()), chunks[i].size());
	}
	return 0;
}